

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O3

void __thiscall
QPropertyAnimation::setPropertyName(QPropertyAnimation *this,QByteArray *propertyName)

{
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *data;
  QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
  *lhs;
  QPropertyAnimationPrivate *this_00;
  QBindingStatus *pQVar1;
  bool bVar2;
  
  this_00 = *(QPropertyAnimationPrivate **)(this + 8);
  data = &(this_00->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.state;
  pQVar1 = (this_00->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
           super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper
              (&(this_00->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.
                super_QObjectPrivate.super_QObjectData.bindingStorage,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation::State>).val == Stopped) {
    lhs = &this_00->propertyName;
    QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(lhs);
    bVar2 = ::operator==((QByteArray *)lhs,propertyName);
    if (!bVar2) {
      QByteArray::operator=((QByteArray *)lhs,propertyName);
      QPropertyAnimationPrivate::updateMetaProperty(this_00);
      QObjectCompatProperty<QPropertyAnimationPrivate,_QByteArray,_&QPropertyAnimationPrivate::_qt_property_propertyName_offset,_&QPropertyAnimationPrivate::setPropertyName,_nullptr,_nullptr>
      ::notify(lhs);
      return;
    }
  }
  else {
    setPropertyName();
  }
  return;
}

Assistant:

void QPropertyAnimation::setPropertyName(const QByteArray &propertyName)
{
    Q_D(QPropertyAnimation);
    if (d->state != QAbstractAnimation::Stopped) {
        qWarning("QPropertyAnimation::setPropertyName: you can't change the property name of a running animation");
        return;
    }

    d->propertyName.removeBindingUnlessInWrapper();

    if (d->propertyName.valueBypassingBindings() == propertyName)
        return;

    d->propertyName.setValueBypassingBindings(propertyName);
    d->updateMetaProperty();
    d->propertyName.notify();
}